

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O3

int pkey_gost_ec_ctrl_str_common(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  int iVar2;
  void *__src;
  long len;
  uchar ukm_buf [32];
  undefined1 local_48 [40];
  
  iVar1 = strcmp(type,"ukmhex");
  if (iVar1 == 0) {
    __src = (void *)OPENSSL_hexstr2buf(value);
    iVar1 = 0;
    if (__src != (void *)0x0) {
      memcpy(local_48,__src,0);
      CRYPTO_free(__src);
      iVar1 = pkey_gost_ctrl(ctx,8,0,local_48);
    }
  }
  else {
    iVar2 = strcmp(type,"vko");
    iVar1 = -2;
    if (iVar2 == 0) {
      iVar1 = atoi(value);
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else if (iVar1 == 0x100) {
        iVar1 = 0x3d6;
      }
      else {
        if (iVar1 != 0x200) {
          ERR_GOST_error(0x9a,0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_pmeth.c"
                         ,0xe6);
          return 0;
        }
        iVar1 = 0x3d7;
      }
      iVar1 = pkey_gost_ctrl(ctx,0x100b,iVar1,(void *)0x0);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int pkey_gost_ec_ctrl_str_common(EVP_PKEY_CTX *ctx,
                                     const char *type, const char *value)
{
  if (0 == strcmp(type, ukm_ctrl_string)) {
    unsigned char ukm_buf[32], *tmp = NULL;
    long len = 0;
    tmp = OPENSSL_hexstr2buf(value, &len);
    if (tmp == NULL)
      return 0;

    if (len > 32) {
      OPENSSL_free(tmp);
      GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_COMMON, GOST_R_CTRL_CALL_FAILED);
      return 0;
    }
    memcpy(ukm_buf, tmp, len);
    OPENSSL_free(tmp);

    return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_SET_IV, len, ukm_buf);
  } else if (strcmp(type, vko_ctrl_string) == 0) {
      int bits = atoi(value);
      int vko_dgst_nid = 0;

      if (bits == 256)
	  vko_dgst_nid = NID_id_GostR3411_2012_256;
      else if (bits == 512)
	  vko_dgst_nid = NID_id_GostR3411_2012_512;
      else if (bits != 0) {
	  GOSTerr(GOST_F_PKEY_GOST_EC_CTRL_STR_COMMON, GOST_R_INVALID_DIGEST_TYPE);
	  return 0;
      }
      return pkey_gost_ctrl(ctx, EVP_PKEY_CTRL_SET_VKO, vko_dgst_nid, NULL);
  }
  return -2;
}